

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cc
# Opt level: O0

leveldb * __thiscall leveldb::DescriptorFileName(leveldb *this,string *dbname,uint64_t number)

{
  char local_88 [8];
  char buf [100];
  uint64_t number_local;
  string *dbname_local;
  
  unique0x10000084 = number;
  if (number != 0) {
    snprintf(local_88,100,"/MANIFEST-%06llu",number);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                   (char *)dbname);
    return this;
  }
  __assert_fail("number > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/filename.cc"
                ,0x2c,"std::string leveldb::DescriptorFileName(const std::string &, uint64_t)");
}

Assistant:

std::string DescriptorFileName(const std::string& dbname, uint64_t number) {
  assert(number > 0);
  char buf[100];
  snprintf(buf, sizeof(buf), "/MANIFEST-%06llu",
           static_cast<unsigned long long>(number));
  return dbname + buf;
}